

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_multiCallsMadeExpectedTimesIsFulfilledAndCannotMatchActualCalls_TestShell::
~TEST_MockExpectedCall_multiCallsMadeExpectedTimesIsFulfilledAndCannotMatchActualCalls_TestShell
          (TEST_MockExpectedCall_multiCallsMadeExpectedTimesIsFulfilledAndCannotMatchActualCalls_TestShell
           *this)

{
  TEST_MockExpectedCall_multiCallsMadeExpectedTimesIsFulfilledAndCannotMatchActualCalls_TestShell
  *this_local;
  
  ~TEST_MockExpectedCall_multiCallsMadeExpectedTimesIsFulfilledAndCannotMatchActualCalls_TestShell
            (this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockExpectedCall, multiCallsMadeExpectedTimesIsFulfilledAndCannotMatchActualCalls)
{
    MockCheckedExpectedCall expectedCall(3);
    expectedCall.withName("name");
    expectedCall.callWasMade(1);
    expectedCall.callWasMade(2);
    expectedCall.callWasMade(3);
    CHECK(expectedCall.isFulfilled());
    CHECK(!expectedCall.canMatchActualCalls());
}